

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
::insert_boundary<std::initializer_list<unsigned_int>>
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
           *this,ID_index cellIndex,initializer_list<unsigned_int> *boundary,Dimension dim)

{
  Index currentIndex;
  unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  *this_00;
  Dimension dim_local;
  initializer_list<unsigned_int> *boundary_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
  *pRStack_10;
  ID_index cellIndex_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  boundary_local._4_4_ = cellIndex;
  pRStack_10 = this;
  if (cellIndex != *(ID_index *)(this + 0x278)) {
    this_00 = (unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               *)RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                 ::_positionToRowIdx((RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                                      *)this);
    std::
    unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::emplace<unsigned_int&,unsigned_int&>
              (this_00,(uint *)(this + 0x278),(uint *)((long)&boundary_local + 4));
    std::
    unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::emplace<unsigned_int&,unsigned_int&>
              ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)(this + 0x88),(uint *)((long)&boundary_local + 4),(uint *)(this + 0x278));
  }
  currentIndex = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
                 ::insert_boundary<std::initializer_list<unsigned_int>>
                           ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
                             *)(this + 0xc0),boundary_local._4_4_,boundary,dim);
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  ::_insert_boundary((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                      *)this,currentIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::insert_boundary(ID_index cellIndex,
                                                      const Boundary_range& boundary,
                                                      Dimension dim)
{
  // maps for possible shifting between column content and position indices used for birth events
  if constexpr (Master_matrix::Option_list::has_column_pairings && !Master_matrix::Option_list::has_vine_update) {
    if (cellIndex != nextEventIndex_) {
      Pair_opt::idToPosition_.emplace(cellIndex, nextEventIndex_);
      if constexpr (Master_matrix::Option_list::has_removable_columns) {
        Pair_opt::PIDM::map_.emplace(nextEventIndex_, cellIndex);
      }
    }
  }
  if constexpr (Master_matrix::Option_list::has_vine_update) {
    if (cellIndex != nextEventIndex_) {
      Swap_opt::_positionToRowIdx().emplace(nextEventIndex_, cellIndex);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        Swap_opt::template RU_pairing<Master_matrix>::idToPosition_.emplace(cellIndex, nextEventIndex_);
      }
    }
  }
  _insert_boundary(reducedMatrixR_.insert_boundary(cellIndex, boundary, dim));
}